

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * __thiscall
fmt::v7::detail::
format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
::on_format_specs(format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *this,int id,char *begin,char *end)

{
  basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *this_00;
  size_t *psVar1;
  undefined1 value [16];
  undefined1 value_00 [16];
  basic_format_specs<char> specs_00;
  basic_format_specs<char> specs_01;
  basic_format_specs<char> specs_02;
  handle handle;
  basic_string_view<char> value_01;
  char *pcVar2;
  long lVar3;
  basic_format_specs<char> specs;
  format_arg arg;
  unkbyte10 in_stack_ffffffffffffff58;
  undefined6 in_stack_ffffffffffffff62;
  format_specs local_98;
  float local_88;
  undefined4 uStack_84;
  undefined2 uStack_80;
  undefined6 uStack_7e;
  int local_78;
  arg_formatter<fmt::v7::detail::buffer_appender<char>,_char> local_68;
  char_spec_handler local_38;
  
  this_00 = &this->context;
  get_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,int>
            ((format_arg *)(&local_98 + 1),(detail *)this_00,
             (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)(ulong)(uint)id,
             (int)end);
  if (local_78 == 0xf) {
    pcVar2 = (this->parse_context).format_str_.data_;
    lVar3 = (long)begin - (long)pcVar2;
    if (lVar3 < 0) {
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/core.h"
                  ,0x146,"negative value");
    }
    (this->parse_context).format_str_.data_ = pcVar2 + lVar3;
    psVar1 = &(this->parse_context).format_str_.size_;
    *psVar1 = *psVar1 - lVar3;
    (*(code *)CONCAT62(uStack_7e,uStack_80))
              (CONCAT44(uStack_84,local_88),&this->parse_context,this_00);
    pcVar2 = (this->parse_context).format_str_.data_;
  }
  else {
    local_98.width = 0;
    local_98.precision = -1;
    local_98.type = '\0';
    local_98._9_1_ = 0;
    local_98.fill.data_[0] = ' ';
    local_98.fill.data_[1] = '\0';
    local_98.fill.data_[2] = '\0';
    local_98.fill.data_[3] = '\0';
    local_98.fill.size_ = '\x01';
    pcVar2 = begin + 1;
    if (((pcVar2 < end) && (*pcVar2 == '}')) && ((byte)((*begin & 0xdfU) + 0xbf) < 0x1a)) {
      local_98._9_3_ = 0x2000;
      local_98.type = *begin;
    }
    else {
      local_68.
      super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      .locale_.locale_ = &this->parse_context;
      local_68.
      super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      .out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)&local_98;
      local_68.ctx_ = (context_type *)&local_68;
      local_68.parse_ctx_ =
           (basic_format_parse_context<char,_fmt::v7::detail::error_handler> *)
           CONCAT44(local_68.parse_ctx_._4_4_,local_78);
      local_68.
      super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      .specs_ = (format_specs *)this_00;
      pcVar2 = parse_format_specs<char,fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>>&>
                         (begin,end,
                          (specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>
                           *)local_68.ctx_);
      if ((pcVar2 == end) || (*pcVar2 != '}')) {
        error_handler::on_error((error_handler *)begin,"missing \'}\' in format string");
      }
    }
    local_68.parse_ctx_ = &this->parse_context;
    local_68.
    super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
    .out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
         (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
         (this->context).out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
    local_68.
    super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
    .locale_.locale_ = (this->context).loc_.locale_;
    local_68.
    super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
    .specs_ = &local_98;
    local_68.ptr_ = (char *)0x0;
    local_68.ctx_ = this_00;
    switch(local_78) {
    case 1:
      arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      ::write_int<int>(&local_68.
                        super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                       ,(int)local_88,&local_98);
      break;
    case 2:
      arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      ::write_int<unsigned_int>
                (&local_68.
                  super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                 ,(uint)local_88,&local_98);
      break;
    case 3:
      arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      ::write_int<long_long>
                (&local_68.
                  super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                 ,CONCAT44(uStack_84,local_88),&local_98);
      break;
    case 4:
      arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      ::write_int<unsigned_long_long>
                (&local_68.
                  super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                 ,CONCAT44(uStack_84,local_88),&local_98);
      break;
    case 5:
      value._10_6_ = in_stack_ffffffffffffff62;
      value._0_10_ = in_stack_ffffffffffffff58;
      arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      ::write_int<__int128>
                (&local_68.
                  super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                 ,(__int128)value,(format_specs *)CONCAT44(uStack_84,local_88));
      break;
    case 6:
      value_00._10_6_ = in_stack_ffffffffffffff62;
      value_00._0_10_ = in_stack_ffffffffffffff58;
      arg_formatter_base<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::error_handler>
      ::write_int<unsigned__int128>
                ((arg_formatter_base<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::error_handler>
                  *)&local_68,(unsigned___int128)value_00,
                 (format_specs *)CONCAT44(uStack_84,local_88));
      break;
    case 7:
      local_68.
      super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      .out_ = arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
              ::operator()(&local_68.
                            super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                           ,local_88._0_1_);
      break;
    case 8:
      local_38.formatter =
           &local_68.
            super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      ;
      local_38.value = local_88._0_1_;
      handle_char_specs<char,fmt::v7::detail::arg_formatter_base<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::error_handler>::char_spec_handler>
                (&local_98,&local_38);
      break;
    case 9:
      specs_02.type = local_98.type;
      specs_02._9_1_ = local_98._9_1_;
      specs_02.fill.data_[0] = local_98.fill.data_[0];
      specs_02.fill.data_[1] = local_98.fill.data_[1];
      specs_02.width = local_98.width;
      specs_02.precision = local_98.precision;
      specs_02.fill.data_[2] = local_98.fill.data_[2];
      specs_02.fill.data_[3] = local_98.fill.data_[3];
      specs_02.fill.size_ = local_98.fill.size_;
      specs_02._15_1_ = local_98._15_1_;
      local_68.
      super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      .out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
           write<char,_fmt::v7::detail::buffer_appender<char>,_float,_0>
                     ((buffer_appender<char>)
                      local_68.
                      super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                      .out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                      local_88,specs_02,
                      local_68.
                      super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                      .locale_);
      break;
    case 10:
      specs_00.type = local_98.type;
      specs_00._9_1_ = local_98._9_1_;
      specs_00.fill.data_[0] = local_98.fill.data_[0];
      specs_00.fill.data_[1] = local_98.fill.data_[1];
      specs_00.width = local_98.width;
      specs_00.precision = local_98.precision;
      specs_00.fill.data_[2] = local_98.fill.data_[2];
      specs_00.fill.data_[3] = local_98.fill.data_[3];
      specs_00.fill.size_ = local_98.fill.size_;
      specs_00._15_1_ = local_98._15_1_;
      local_68.
      super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      .out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
           write<char,_fmt::v7::detail::buffer_appender<char>,_double,_0>
                     ((buffer_appender<char>)
                      local_68.
                      super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                      .out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                      (double)CONCAT44(uStack_84,local_88),specs_00,
                      local_68.
                      super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                      .locale_);
      break;
    case 0xb:
      specs_01.type = local_98.type;
      specs_01._9_1_ = local_98._9_1_;
      specs_01.fill.data_[0] = local_98.fill.data_[0];
      specs_01.fill.data_[1] = local_98.fill.data_[1];
      specs_01.width = local_98.width;
      specs_01.precision = local_98.precision;
      specs_01.fill.data_[2] = local_98.fill.data_[2];
      specs_01.fill.data_[3] = local_98.fill.data_[3];
      specs_01.fill.size_ = local_98.fill.size_;
      specs_01._15_1_ = local_98._15_1_;
      local_68.
      super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      .out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
           write<char,_fmt::v7::detail::buffer_appender<char>,_long_double,_0>
                     ((buffer_appender<char>)
                      local_68.
                      super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                      .out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                      (longdouble)CONCAT28(uStack_80,CONCAT44(uStack_84,local_88)),specs_01,
                      local_68.
                      super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                      .locale_);
      break;
    case 0xc:
      local_68.
      super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      .out_ = arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
              ::operator()(&local_68.
                            super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                           ,(char *)CONCAT44(uStack_84,local_88));
      break;
    case 0xd:
      value_01.data_._4_4_ = uStack_84;
      value_01.data_._0_4_ = local_88;
      value_01.size_._0_2_ = uStack_80;
      value_01.size_._2_6_ = uStack_7e;
      local_68.
      super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      .out_ = arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
              ::operator()(&local_68.
                            super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                           ,value_01);
      break;
    case 0xe:
      local_68.
      super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      .out_ = arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
              ::operator()(&local_68.
                            super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                           ,(void *)CONCAT44(uStack_84,local_88));
      break;
    case 0xf:
      handle.custom_.value._4_4_ = uStack_84;
      handle.custom_.value._0_4_ = local_88;
      handle.custom_.format._0_2_ = uStack_80;
      handle.custom_.format._2_6_ = uStack_7e;
      local_68.
      super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      .out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
           arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>::operator()(&local_68,handle)
      ;
      break;
    default:
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/format.h"
                  ,0x8c2,"invalid argument type");
    }
    (this_00->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
         (buffer<char> *)
         local_68.
         super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
         .out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  }
  return pcVar2;
}

Assistant:

const Char* on_format_specs(int id, const Char* begin, const Char* end) {
    auto arg = get_arg(context, id);
    if (arg.type() == type::custom_type) {
      advance_to(parse_context, begin);
      visit_format_arg(custom_formatter<Context>(parse_context, context), arg);
      return parse_context.begin();
    }
    auto specs = basic_format_specs<Char>();
    if (begin + 1 < end && begin[1] == '}' && is_ascii_letter(*begin)) {
      specs.type = static_cast<char>(*begin++);
    } else {
      using parse_context_t = basic_format_parse_context<Char>;
      specs_checker<specs_handler<parse_context_t, Context>> handler(
          specs_handler<parse_context_t, Context>(specs, parse_context,
                                                  context),
          arg.type());
      begin = parse_format_specs(begin, end, handler);
      if (begin == end || *begin != '}')
        on_error("missing '}' in format string");
    }
    context.advance_to(visit_format_arg(
        arg_formatter<OutputIt, Char>(context, &parse_context, &specs), arg));
    return begin;
  }